

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O2

int sfp_get_sonet_compliance_codes(tcv_t *tcv,tcv_sonet_compliance_codes_t *codes)

{
  uint16_t uVar1;
  ushort uVar2;
  int iVar3;
  
  iVar3 = -4;
  if ((codes != (tcv_sonet_compliance_codes_t *)0x0 && tcv != (tcv_t *)0x0) &&
     (tcv->data != (void *)0x0)) {
    codes->bmp = 0;
    uVar2 = *(byte *)((long)tcv->data + 5) >> 5 & 1;
    codes->bmp = uVar2;
    uVar2 = *(byte *)((long)tcv->data + 5) >> 1 & 2 | uVar2;
    codes->bmp = uVar2;
    uVar1 = uVar2 + (*(byte *)((long)tcv->data + 5) & 2) * 2;
    codes->bmp = uVar1;
    uVar2 = uVar1 + (*(byte *)((long)tcv->data + 5) & 1) * 8;
    codes->bmp = uVar2;
    uVar2 = *(byte *)((long)tcv->data + 6) >> 2 & 0x10 | uVar2;
    codes->bmp = uVar2;
    uVar2 = *(byte *)((long)tcv->data + 6) & 0x20 | uVar2;
    codes->bmp = uVar2;
    uVar2 = uVar2 + (*(byte *)((long)tcv->data + 6) & 0x10) * 4;
    codes->bmp = uVar2;
    uVar2 = (*(byte *)((long)tcv->data + 6) & 4) << 5 | uVar2;
    codes->bmp = uVar2;
    uVar2 = (*(byte *)((long)tcv->data + 6) & 2) << 7 | uVar2;
    codes->bmp = uVar2;
    codes->bmp = (*(byte *)((long)tcv->data + 6) & 1) << 9 | uVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int sfp_get_sonet_compliance_codes(tcv_t *tcv, tcv_sonet_compliance_codes_t *codes)
{
	if (tcv == NULL || codes == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	codes->bmp = 0;

	codes->bits.oc_192_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC192_SR);
	codes->bits.oc_48_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_LR);
	codes->bits.oc_48_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_IR);
	codes->bits.oc_48_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_SR);
	codes->bits.oc_12_sm_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SM_LR);
	codes->bits.oc_12_sm_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SM_IR);
	codes->bits.oc_12_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SR);
	codes->bits.oc_3_sm_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SM_LR);
	codes->bits.oc_3_sm_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SM_IR);
	codes->bits.oc_3_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SR);

	return 0;
}